

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
toml::Value::ValueConverter<std::vector<int,_std::allocator<int>_>_>::to
          (ValueConverter<std::vector<int,_std::allocator<int>_>_> *this,Value *v)

{
  bool bVar1;
  Value *in_RDI;
  Value *element;
  const_iterator __end2;
  const_iterator __begin2;
  Array *__range2;
  Array *array;
  vector<int,_std::allocator<int>_> *result;
  undefined4 in_stack_ffffffffffffff88;
  return_type_conflict in_stack_ffffffffffffff8c;
  Value *this_00;
  Value *in_stack_ffffffffffffffa0;
  __normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
  local_38;
  return_type local_30;
  undefined1 local_21;
  return_type local_20;
  
  this_00 = in_RDI;
  local_20 = as<std::vector<toml::Value,std::allocator<toml::Value>>>(in_RDI);
  bVar1 = std::vector<toml::Value,_std::allocator<toml::Value>_>::empty
                    ((vector<toml::Value,_std::allocator<toml::Value>_> *)in_stack_ffffffffffffffa0)
  ;
  if (bVar1) {
    memset(this_00,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23bbda);
  }
  else {
    std::vector<toml::Value,_std::allocator<toml::Value>_>::front
              ((vector<toml::Value,_std::allocator<toml::Value>_> *)this_00);
    assureType<int>(in_stack_ffffffffffffffa0);
    local_21 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23bc00);
    local_30 = local_20;
    local_38._M_current =
         (Value *)std::vector<toml::Value,_std::allocator<toml::Value>_>::begin
                            ((vector<toml::Value,_std::allocator<toml::Value>_> *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<toml::Value,_std::allocator<toml::Value>_>::end
              ((vector<toml::Value,_std::allocator<toml::Value>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
                               *)this_00,
                              (__normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
      ::operator*(&local_38);
      in_stack_ffffffffffffff8c = as<int>(this_00);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this_00,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      __gnu_cxx::
      __normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
      ::operator++(&local_38);
    }
  }
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<T> to(const Value& v)
    {
        const Array& array = v.as<Array>();
        if (array.empty())
            return std::vector<T>();
        array.front().assureType<T>();

        std::vector<T> result;
        for (const auto& element : array) {
            result.push_back(element.as<T>());
        }

        return result;
    }